

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O0

int64_t parse_uint(uint8_t *s,size_t len)

{
  ulong local_30;
  size_t i;
  int64_t n;
  size_t len_local;
  uint8_t *s_local;
  
  i = 0;
  if (len == 0) {
    s_local = (uint8_t *)0xffffffffffffffff;
  }
  else {
    for (local_30 = 0; local_30 < len; local_30 = local_30 + 1) {
      if ((s[local_30] < 0x30) || (0x39 < s[local_30])) {
        return -1;
      }
      if (0xccccccccccccccc < (long)i) {
        return -1;
      }
      if (0x7fffffffffffffff - (long)(int)(s[local_30] - 0x30) < (long)(i * 10)) {
        return -1;
      }
      i = (long)(int)(s[local_30] - 0x30) + i * 10;
    }
    s_local = (uint8_t *)i;
  }
  return (int64_t)s_local;
}

Assistant:

static int64_t parse_uint(const uint8_t *s, size_t len) {
  int64_t n = 0;
  size_t i;
  if (len == 0) {
    return -1;
  }
  for (i = 0; i < len; ++i) {
    if ('0' <= s[i] && s[i] <= '9') {
      if (n > INT64_MAX / 10) {
        return -1;
      }
      n *= 10;
      if (n > INT64_MAX - (s[i] - '0')) {
        return -1;
      }
      n += s[i] - '0';
      continue;
    }
    return -1;
  }
  return n;
}